

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_wrapper.h
# Opt level: O0

double L18_4::use_f<double,std::function<double(double)>>(double v,function<double_(double)> *f)

{
  ostream *poVar1;
  void *this;
  double dVar2;
  function<double_(double)> *f_local;
  double v_local;
  
  use_f<double,_std::function<double_(double)>_>::count =
       use_f<double,_std::function<double_(double)>_>::count + 1;
  poVar1 = std::operator<<((ostream *)&std::cout," use_f count = ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,use_f<double,_std::function<double_(double)>_>::count);
  poVar1 = std::operator<<(poVar1,", &count = ");
  this = (void *)std::ostream::operator<<
                           (poVar1,&use_f<double,_std::function<double_(double)>_>::count);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  dVar2 = std::function<double_(double)>::operator()(f,v);
  return dVar2;
}

Assistant:

T use_f(T v, F f) {
        static int count = 0;
        count ++;
        std::cout << " use_f count = " << count << ", &count = " << &count << std::endl;
        return f(v);
    }